

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_fwd.hpp
# Opt level: O1

void __thiscall toml::detail::maybe::maybe(maybe *this,maybe *param_1)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var2;
  undefined4 extraout_var;
  
  (this->super_scanner_base)._vptr_scanner_base = (_func_int **)&PTR__maybe_00569ae8;
  (this->other_).scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = (scanner_base *)0x0;
  _Var1._M_head_impl =
       (param_1->other_).scanner_._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (scanner_base *)0x0) {
    _Var2._M_head_impl._0_4_ = (*(_Var1._M_head_impl)->_vptr_scanner_base[3])();
    _Var2._M_head_impl._4_4_ = extraout_var;
    _Var1._M_head_impl =
         (this->other_).scanner_._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (this->other_).scanner_._M_t.
    super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
    ._M_t.
    super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
    .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (scanner_base *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_scanner_base[1])();
      return;
    }
  }
  return;
}

Assistant:

maybe(const maybe&)            = default;